

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgmesh.cpp
# Opt level: O0

void __thiscall TPZGeoMesh::~TPZGeoMesh(TPZGeoMesh *this)

{
  void *in_RDI;
  
  ~TPZGeoMesh((TPZGeoMesh *)0x1a263b8);
  operator_delete(in_RDI,0x2a8);
  return;
}

Assistant:

TPZGeoMesh::~TPZGeoMesh()
{
#ifdef PZDEBUG2
    std::cout << "Deleting TPZGeoMesh " << (void *) this << std::endl;
#endif
	CleanUp();
}